

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O0

void close_unix_descriptors(void)

{
  int iVar1;
  int local_c;
  int slot;
  
  for (local_c = 0; local_c < NPROCS; local_c = local_c + 1) {
    switch(UJ[local_c].type) {
    case UJUNUSED:
      break;
    case UJSOSTREAM:
      close(local_c);
      break;
    case UJSOCKET:
      close(local_c);
      if (UJ[local_c].pathname != (char *)0x0) {
        unlink(UJ[local_c].pathname);
        free(UJ[local_c].pathname);
        UJ[local_c].pathname = (char *)0x0;
      }
      break;
    case UJPROCESS:
      iVar1 = kill(UJ[local_c].PID,9);
      if (iVar1 < 0) {
        perror("Killing process");
      }
      UJ[local_c].PID = 0;
      close(local_c);
      break;
    case UJSHELL:
      iVar1 = kill(UJ[local_c].PID,9);
      if (iVar1 < 0) {
        perror("Killing shell");
      }
      UJ[local_c].PID = 0;
      close(local_c);
    }
    UJ[local_c].type = UJUNUSED;
  }
  wait_for_comm_processes();
  return;
}

Assistant:

void close_unix_descriptors(void) /* Get ready to shut Maiko down */
{
  for (int slot = 0; slot < NPROCS; slot++) {
    /* If this slot has an active job */
    switch (UJ[slot].type) {
      case UJUNUSED:
        break;
      case UJSHELL:
        if (kill(UJ[slot].PID, SIGKILL) < 0) perror("Killing shell");
        UJ[slot].PID = 0;
        DBPRINT(("Kill 5 closing shell desc %d.\n", slot));
        close(slot);
        break;

      case UJPROCESS:
        if (kill(UJ[slot].PID, SIGKILL) < 0) perror("Killing process");
        UJ[slot].PID = 0;
        DBPRINT(("Kill 5 closing process desc %d.\n", slot));
        close(slot);
        break;

      case UJSOCKET:
        close(slot);
        if (UJ[slot].pathname != NULL) {
          /* socket created directly from Lisp; pathname is in .pathname */
          DBPRINT(("Closing socket %d bound to %s\n", slot, UJ[slot].pathname));
          unlink(UJ[slot].pathname);
          free(UJ[slot].pathname);
          UJ[slot].pathname = NULL;
        }
        break;

      case UJSOSTREAM: close(slot); break;
    }
    UJ[slot].type = UJUNUSED;
  }

  /* make sure everyone's really dead before proceeding */
  wait_for_comm_processes();
}